

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *maxviol,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *sumviol)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer pnVar4;
  undefined8 uVar5;
  bool bVar6;
  VarStatus VVar7;
  int iVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_b8;
  uint *local_38;
  
  bVar15 = 0;
  bVar1 = this->_hasBasis;
  if (bVar1 == true) {
    if ((this->_hasSolRational == true) && (this->_hasSolReal == false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sumviol,0.0);
    uVar14 = (ulong)(this->_realLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
    if (0 < (long)uVar14) {
      local_38 = (maxviol->m_backend).data._M_elems + 1;
      lVar13 = uVar14 << 7;
      do {
        VVar7 = basisRowStatus(this,(int)(uVar14 - 1));
        if (this->_currentSettings->_intParamValues[0] == -1) {
          if (((VVar7 & ~FIXED) != ON_UPPER) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8);
            if (iVar8 < 0) {
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar11 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
              pcVar12 = &local_b8;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4)
                ;
              }
              local_b8.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
              local_b8.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
              local_b8._120_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
              if (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,&local_b8);
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar10 = maxviol;
              pcVar12 = &local_b8;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4)
                ;
              }
              local_b8.exp = (maxviol->m_backend).exp;
              local_b8.neg = (maxviol->m_backend).neg;
              local_b8.fpclass = (maxviol->m_backend).fpclass;
              local_b8.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              if (((local_b8.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8),
                 iVar8 < 0)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar3 = *(uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
                puVar11 = (uint *)((long)&(pnVar4->m_backend).data + lVar13 + -0x7c);
                pcVar12 = &local_b8;
                for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
                }
                iVar8 = *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
                uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
                bVar2 = *(byte *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
                (maxviol->m_backend).data._M_elems[0] = uVar3;
                pcVar12 = &local_b8;
                puVar11 = local_38;
                for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar11 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                }
                (maxviol->m_backend).exp = iVar8;
                (maxviol->m_backend).neg = (bool)((uVar3 != 0 || (int)uVar5 != 0) ^ bVar2);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
          if ((VVar7 - ZERO < 0xfffffffe) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8);
            if (0 < iVar8) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->_solReal)._dual.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar13));
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar13),&maxviol->m_backend
                                    ), 0 < iVar8)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar11 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
                pnVar10 = maxviol;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar10->m_backend).data._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
                }
                (maxviol->m_backend).exp =
                     *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
                uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
        }
        else {
          if (((VVar7 & ~FIXED) != ON_UPPER) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8);
            if (0 < iVar8) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->_solReal)._dual.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar13));
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar13),&maxviol->m_backend
                                    ), 0 < iVar8)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar11 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
                pnVar10 = maxviol;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar10->m_backend).data._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
                }
                (maxviol->m_backend).exp =
                     *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
                uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
          if ((VVar7 - ZERO < 0xfffffffe) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8);
            if (iVar8 < 0) {
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar11 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
              pcVar12 = &local_b8;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar11;
                puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4)
                ;
              }
              local_b8.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
              local_b8.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
              local_b8._120_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
              if (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,&local_b8);
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar10 = maxviol;
              pcVar12 = &local_b8;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4)
                ;
              }
              local_b8.exp = (maxviol->m_backend).exp;
              local_b8.neg = (maxviol->m_backend).neg;
              local_b8.fpclass = (maxviol->m_backend).fpclass;
              local_b8.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              if (((local_b8.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&(pnVar4->m_backend).data + lVar13 + -8) != 2)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar13),&local_b8),
                 iVar8 < 0)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar3 = *(uint *)((long)&pnVar4[-1].m_backend.data + lVar13);
                puVar11 = (uint *)((long)&(pnVar4->m_backend).data + lVar13 + -0x7c);
                pcVar12 = &local_b8;
                for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
                }
                iVar8 = *(int *)((long)&(pnVar4->m_backend).data + lVar13 + -0x10);
                uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar13 + -8);
                bVar2 = *(byte *)((long)&(pnVar4->m_backend).data + lVar13 + -0xc);
                (maxviol->m_backend).data._M_elems[0] = uVar3;
                pcVar12 = &local_b8;
                puVar11 = local_38;
                for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar11 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
                  puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
                }
                (maxviol->m_backend).exp = iVar8;
                (maxviol->m_backend).neg = (bool)((uVar3 != 0 || (int)uVar5 != 0) ^ bVar2);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
        }
        lVar13 = lVar13 + -0x80;
        bVar6 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar6);
    }
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}